

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage4_high32_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  uint uVar101;
  int iVar102;
  uint uVar103;
  int iVar104;
  uint uVar105;
  int iVar106;
  uint uVar107;
  int iVar108;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m12_m52;
  __m128i cospi_p12_p52;
  __m128i cospi_m52_p12;
  __m128i cospi_m44_m20;
  __m128i cospi_p44_p20;
  __m128i cospi_m20_p44;
  __m128i cospi_m28_m36;
  __m128i cospi_p28_p36;
  __m128i cospi_m36_p28;
  __m128i cospi_m60_m04;
  __m128i cospi_p60_p04;
  __m128i cospi_m04_p60;
  undefined2 local_1188;
  undefined2 uStack_1186;
  undefined2 uStack_1184;
  undefined2 uStack_1182;
  undefined2 local_1178;
  undefined2 uStack_1176;
  undefined2 uStack_1174;
  undefined2 uStack_1172;
  undefined2 local_1168;
  undefined2 uStack_1166;
  undefined2 uStack_1164;
  undefined2 uStack_1162;
  undefined2 local_1158;
  undefined2 uStack_1156;
  undefined2 uStack_1154;
  undefined2 uStack_1152;
  undefined2 local_1148;
  undefined2 uStack_1146;
  undefined2 uStack_1144;
  undefined2 uStack_1142;
  undefined2 local_1138;
  undefined2 uStack_1136;
  undefined2 uStack_1134;
  undefined2 uStack_1132;
  undefined2 local_1128;
  undefined2 uStack_1126;
  undefined2 uStack_1124;
  undefined2 uStack_1122;
  undefined2 local_1118;
  undefined2 uStack_1116;
  undefined2 uStack_1114;
  undefined2 uStack_1112;
  undefined2 local_1108;
  undefined2 uStack_1106;
  undefined2 uStack_1104;
  undefined2 uStack_1102;
  undefined2 local_10f8;
  undefined2 uStack_10f6;
  undefined2 uStack_10f4;
  undefined2 uStack_10f2;
  undefined2 local_10e8;
  undefined2 uStack_10e6;
  undefined2 uStack_10e4;
  undefined2 uStack_10e2;
  undefined2 local_10d8;
  undefined2 uStack_10d6;
  undefined2 uStack_10d4;
  undefined2 uStack_10d2;
  undefined2 local_10c8;
  undefined2 uStack_10c6;
  undefined2 uStack_10c4;
  undefined2 uStack_10c2;
  undefined2 local_10b8;
  undefined2 uStack_10b6;
  undefined2 uStack_10b4;
  undefined2 uStack_10b2;
  undefined2 local_10a8;
  undefined2 uStack_10a6;
  undefined2 uStack_10a4;
  undefined2 uStack_10a2;
  undefined2 local_1098;
  undefined2 uStack_1096;
  undefined2 uStack_1094;
  undefined2 uStack_1092;
  undefined2 uStack_1080;
  undefined2 uStack_107e;
  undefined2 uStack_107c;
  undefined2 uStack_107a;
  undefined2 uStack_1070;
  undefined2 uStack_106e;
  undefined2 uStack_106c;
  undefined2 uStack_106a;
  undefined2 uStack_1060;
  undefined2 uStack_105e;
  undefined2 uStack_105c;
  undefined2 uStack_105a;
  undefined2 uStack_1050;
  undefined2 uStack_104e;
  undefined2 uStack_104c;
  undefined2 uStack_104a;
  undefined2 uStack_1040;
  undefined2 uStack_103e;
  undefined2 uStack_103c;
  undefined2 uStack_103a;
  undefined2 uStack_1030;
  undefined2 uStack_102e;
  undefined2 uStack_102c;
  undefined2 uStack_102a;
  undefined2 uStack_1020;
  undefined2 uStack_101e;
  undefined2 uStack_101c;
  undefined2 uStack_101a;
  undefined2 uStack_1010;
  undefined2 uStack_100e;
  undefined2 uStack_100c;
  undefined2 uStack_100a;
  undefined2 uStack_1000;
  undefined2 uStack_ffe;
  undefined2 uStack_ffc;
  undefined2 uStack_ffa;
  undefined2 uStack_ff0;
  undefined2 uStack_fee;
  undefined2 uStack_fec;
  undefined2 uStack_fea;
  undefined2 uStack_fe0;
  undefined2 uStack_fde;
  undefined2 uStack_fdc;
  undefined2 uStack_fda;
  undefined2 uStack_fd0;
  undefined2 uStack_fce;
  undefined2 uStack_fcc;
  undefined2 uStack_fca;
  undefined2 uStack_fc0;
  undefined2 uStack_fbe;
  undefined2 uStack_fbc;
  undefined2 uStack_fba;
  undefined2 uStack_fb0;
  undefined2 uStack_fae;
  undefined2 uStack_fac;
  undefined2 uStack_faa;
  undefined2 uStack_fa0;
  undefined2 uStack_f9e;
  undefined2 uStack_f9c;
  undefined2 uStack_f9a;
  undefined2 uStack_f90;
  undefined2 uStack_f8e;
  undefined2 uStack_f8c;
  undefined2 uStack_f8a;
  undefined4 local_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 local_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 local_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 local_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 local_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 local_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 local_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined4 local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 local_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  
  uVar101 = -*(int *)(in_RSI + 0x10) & 0xffffU | *(int *)(in_RSI + 0xf0) << 0x10;
  uVar93 = CONCAT44(uVar101,uVar101);
  uVar94 = CONCAT44(uVar101,uVar101);
  uVar101 = (uint)*(ushort *)(in_RSI + 0xf0) | *(int *)(in_RSI + 0x10) << 0x10;
  iVar102 = (-*(int *)(in_RSI + 0xf0) & 0xffffU) + *(int *)(in_RSI + 0x10) * -0x10000;
  uVar103 = -*(int *)(in_RSI + 0x90) & 0xffffU | *(int *)(in_RSI + 0x70) << 0x10;
  uVar95 = CONCAT44(uVar103,uVar103);
  uVar96 = CONCAT44(uVar103,uVar103);
  uVar103 = (uint)*(ushort *)(in_RSI + 0x70) | *(int *)(in_RSI + 0x90) << 0x10;
  iVar104 = (-*(int *)(in_RSI + 0x70) & 0xffffU) + *(int *)(in_RSI + 0x90) * -0x10000;
  uVar105 = -*(int *)(in_RSI + 0x50) & 0xffffU | *(int *)(in_RSI + 0xb0) << 0x10;
  uVar97 = CONCAT44(uVar105,uVar105);
  uVar98 = CONCAT44(uVar105,uVar105);
  uVar105 = (uint)*(ushort *)(in_RSI + 0xb0) | *(int *)(in_RSI + 0x50) << 0x10;
  iVar106 = (-*(int *)(in_RSI + 0xb0) & 0xffffU) + *(int *)(in_RSI + 0x50) * -0x10000;
  uVar107 = -*(int *)(in_RSI + 0xd0) & 0xffffU | *(int *)(in_RSI + 0x30) << 0x10;
  uVar99 = CONCAT44(uVar107,uVar107);
  uVar100 = CONCAT44(uVar107,uVar107);
  uVar107 = (uint)*(ushort *)(in_RSI + 0x30) | *(int *)(in_RSI + 0xd0) << 0x10;
  iVar108 = (-*(int *)(in_RSI + 0x30) & 0xffffU) + *(int *)(in_RSI + 0xd0) * -0x10000;
  uVar1 = *(undefined8 *)(in_RDI + 0x210);
  uVar2 = *(undefined8 *)(in_RDI + 0x3e0);
  local_1098 = (undefined2)uVar1;
  uStack_1096 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1094 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1092 = (undefined2)((ulong)uVar1 >> 0x30);
  local_10a8 = (undefined2)uVar2;
  uStack_10a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x218);
  uVar2 = *(undefined8 *)(in_RDI + 1000);
  uStack_f90 = (undefined2)uVar1;
  uStack_f8e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f8c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f8a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fa0 = (undefined2)uVar2;
  uStack_f9e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f9c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f9a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar60._2_2_ = local_10a8;
  auVar60._0_2_ = local_1098;
  auVar60._4_2_ = uStack_1096;
  auVar60._6_2_ = uStack_10a6;
  auVar60._10_2_ = uStack_10a4;
  auVar60._8_2_ = uStack_1094;
  auVar60._12_2_ = uStack_1092;
  auVar60._14_2_ = uStack_10a2;
  auVar59._8_8_ = uVar94;
  auVar59._0_8_ = uVar93;
  auVar109 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_fa0;
  auVar58._0_2_ = uStack_f90;
  auVar58._4_2_ = uStack_f8e;
  auVar58._6_2_ = uStack_f9e;
  auVar58._10_2_ = uStack_f9c;
  auVar58._8_2_ = uStack_f8c;
  auVar58._12_2_ = uStack_f8a;
  auVar58._14_2_ = uStack_f9a;
  auVar57._8_8_ = uVar94;
  auVar57._0_8_ = uVar93;
  auVar110 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_10a8;
  auVar56._0_2_ = local_1098;
  auVar56._4_2_ = uStack_1096;
  auVar56._6_2_ = uStack_10a6;
  auVar56._10_2_ = uStack_10a4;
  auVar56._8_2_ = uStack_1094;
  auVar56._12_2_ = uStack_1092;
  auVar56._14_2_ = uStack_10a2;
  auVar55._8_8_ = CONCAT44(uVar101,uVar101);
  auVar55._0_8_ = CONCAT44(uVar101,uVar101);
  auVar111 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_fa0;
  auVar54._0_2_ = uStack_f90;
  auVar54._4_2_ = uStack_f8e;
  auVar54._6_2_ = uStack_f9e;
  auVar54._10_2_ = uStack_f9c;
  auVar54._8_2_ = uStack_f8c;
  auVar54._12_2_ = uStack_f8a;
  auVar54._14_2_ = uStack_f9a;
  auVar53._8_8_ = CONCAT44(uVar101,uVar101);
  auVar53._0_8_ = CONCAT44(uVar101,uVar101);
  auVar112 = pmaddwd(auVar54,auVar53);
  local_798 = auVar109._0_4_;
  uStack_794 = auVar109._4_4_;
  uStack_790 = auVar109._8_4_;
  uStack_78c = auVar109._12_4_;
  local_7a8 = (int)in_XMM0_Qa;
  uStack_7a4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_7a0 = (int)in_XMM0_Qb;
  uStack_79c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_7b8 = auVar110._0_4_;
  uStack_7b4 = auVar110._4_4_;
  uStack_7b0 = auVar110._8_4_;
  uStack_7ac = auVar110._12_4_;
  local_7d8 = auVar111._0_4_;
  uStack_7d4 = auVar111._4_4_;
  uStack_7d0 = auVar111._8_4_;
  uStack_7cc = auVar111._12_4_;
  local_7f8 = auVar112._0_4_;
  uStack_7f4 = auVar112._4_4_;
  uStack_7f0 = auVar112._8_4_;
  uStack_7ec = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar92._4_4_ = uStack_794 + uStack_7a4 >> auVar109;
  auVar92._0_4_ = local_798 + local_7a8 >> auVar109;
  auVar92._12_4_ = uStack_78c + uStack_79c >> auVar109;
  auVar92._8_4_ = uStack_790 + uStack_7a0 >> auVar109;
  auVar91._4_4_ = uStack_7b4 + uStack_7a4 >> auVar110;
  auVar91._0_4_ = local_7b8 + local_7a8 >> auVar110;
  auVar91._12_4_ = uStack_7ac + uStack_79c >> auVar110;
  auVar91._8_4_ = uStack_7b0 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar92,auVar91);
  *(undefined1 (*) [16])(in_RDI + 0x210) = auVar109;
  auVar90._4_4_ = uStack_7d4 + uStack_7a4 >> auVar111;
  auVar90._0_4_ = local_7d8 + local_7a8 >> auVar111;
  auVar90._12_4_ = uStack_7cc + uStack_79c >> auVar111;
  auVar90._8_4_ = uStack_7d0 + uStack_7a0 >> auVar111;
  auVar89._4_4_ = uStack_7f4 + uStack_7a4 >> auVar112;
  auVar89._0_4_ = local_7f8 + local_7a8 >> auVar112;
  auVar89._12_4_ = uStack_7ec + uStack_79c >> auVar112;
  auVar89._8_4_ = uStack_7f0 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar90,auVar89);
  *(undefined1 (*) [16])(in_RDI + 0x3e0) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x220);
  uVar2 = *(undefined8 *)(in_RDI + 0x3d0);
  local_10b8 = (undefined2)uVar1;
  uStack_10b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_10c8 = (undefined2)uVar2;
  uStack_10c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x228);
  uVar2 = *(undefined8 *)(in_RDI + 0x3d8);
  uStack_fb0 = (undefined2)uVar1;
  uStack_fae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_fac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_faa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fc0 = (undefined2)uVar2;
  uStack_fbe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fbc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar52._2_2_ = local_10c8;
  auVar52._0_2_ = local_10b8;
  auVar52._4_2_ = uStack_10b6;
  auVar52._6_2_ = uStack_10c6;
  auVar52._10_2_ = uStack_10c4;
  auVar52._8_2_ = uStack_10b4;
  auVar52._12_2_ = uStack_10b2;
  auVar52._14_2_ = uStack_10c2;
  auVar51._8_8_ = CONCAT44(iVar102,iVar102);
  auVar51._0_8_ = CONCAT44(iVar102,iVar102);
  auVar109 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_fc0;
  auVar50._0_2_ = uStack_fb0;
  auVar50._4_2_ = uStack_fae;
  auVar50._6_2_ = uStack_fbe;
  auVar50._10_2_ = uStack_fbc;
  auVar50._8_2_ = uStack_fac;
  auVar50._12_2_ = uStack_faa;
  auVar50._14_2_ = uStack_fba;
  auVar49._8_8_ = CONCAT44(iVar102,iVar102);
  auVar49._0_8_ = CONCAT44(iVar102,iVar102);
  auVar110 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_10c8;
  auVar48._0_2_ = local_10b8;
  auVar48._4_2_ = uStack_10b6;
  auVar48._6_2_ = uStack_10c6;
  auVar48._10_2_ = uStack_10c4;
  auVar48._8_2_ = uStack_10b4;
  auVar48._12_2_ = uStack_10b2;
  auVar48._14_2_ = uStack_10c2;
  auVar47._8_8_ = uVar94;
  auVar47._0_8_ = uVar93;
  auVar111 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_fc0;
  auVar46._0_2_ = uStack_fb0;
  auVar46._4_2_ = uStack_fae;
  auVar46._6_2_ = uStack_fbe;
  auVar46._10_2_ = uStack_fbc;
  auVar46._8_2_ = uStack_fac;
  auVar46._12_2_ = uStack_faa;
  auVar46._14_2_ = uStack_fba;
  auVar45._8_8_ = uVar94;
  auVar45._0_8_ = uVar93;
  auVar112 = pmaddwd(auVar46,auVar45);
  local_818 = auVar109._0_4_;
  uStack_814 = auVar109._4_4_;
  uStack_810 = auVar109._8_4_;
  uStack_80c = auVar109._12_4_;
  local_838 = auVar110._0_4_;
  uStack_834 = auVar110._4_4_;
  uStack_830 = auVar110._8_4_;
  uStack_82c = auVar110._12_4_;
  local_858 = auVar111._0_4_;
  uStack_854 = auVar111._4_4_;
  uStack_850 = auVar111._8_4_;
  uStack_84c = auVar111._12_4_;
  local_878 = auVar112._0_4_;
  uStack_874 = auVar112._4_4_;
  uStack_870 = auVar112._8_4_;
  uStack_86c = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar88._4_4_ = uStack_814 + uStack_7a4 >> auVar109;
  auVar88._0_4_ = local_818 + local_7a8 >> auVar109;
  auVar88._12_4_ = uStack_80c + uStack_79c >> auVar109;
  auVar88._8_4_ = uStack_810 + uStack_7a0 >> auVar109;
  auVar87._4_4_ = uStack_834 + uStack_7a4 >> auVar110;
  auVar87._0_4_ = local_838 + local_7a8 >> auVar110;
  auVar87._12_4_ = uStack_82c + uStack_79c >> auVar110;
  auVar87._8_4_ = uStack_830 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar88,auVar87);
  *(undefined1 (*) [16])(in_RDI + 0x220) = auVar109;
  auVar86._4_4_ = uStack_854 + uStack_7a4 >> auVar111;
  auVar86._0_4_ = local_858 + local_7a8 >> auVar111;
  auVar86._12_4_ = uStack_84c + uStack_79c >> auVar111;
  auVar86._8_4_ = uStack_850 + uStack_7a0 >> auVar111;
  auVar85._4_4_ = uStack_874 + uStack_7a4 >> auVar112;
  auVar85._0_4_ = local_878 + local_7a8 >> auVar112;
  auVar85._12_4_ = uStack_86c + uStack_79c >> auVar112;
  auVar85._8_4_ = uStack_870 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar86,auVar85);
  *(undefined1 (*) [16])(in_RDI + 0x3d0) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x250);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a0);
  local_10d8 = (undefined2)uVar1;
  uStack_10d6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10d4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10d2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_10e8 = (undefined2)uVar2;
  uStack_10e6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10e4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10e2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 600);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a8);
  uStack_fd0 = (undefined2)uVar1;
  uStack_fce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_fcc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_fca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fe0 = (undefined2)uVar2;
  uStack_fde = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fdc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fda = (undefined2)((ulong)uVar2 >> 0x30);
  auVar44._2_2_ = local_10e8;
  auVar44._0_2_ = local_10d8;
  auVar44._4_2_ = uStack_10d6;
  auVar44._6_2_ = uStack_10e6;
  auVar44._10_2_ = uStack_10e4;
  auVar44._8_2_ = uStack_10d4;
  auVar44._12_2_ = uStack_10d2;
  auVar44._14_2_ = uStack_10e2;
  auVar43._8_8_ = uVar96;
  auVar43._0_8_ = uVar95;
  auVar109 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_fe0;
  auVar42._0_2_ = uStack_fd0;
  auVar42._4_2_ = uStack_fce;
  auVar42._6_2_ = uStack_fde;
  auVar42._10_2_ = uStack_fdc;
  auVar42._8_2_ = uStack_fcc;
  auVar42._12_2_ = uStack_fca;
  auVar42._14_2_ = uStack_fda;
  auVar41._8_8_ = uVar96;
  auVar41._0_8_ = uVar95;
  auVar110 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_10e8;
  auVar40._0_2_ = local_10d8;
  auVar40._4_2_ = uStack_10d6;
  auVar40._6_2_ = uStack_10e6;
  auVar40._10_2_ = uStack_10e4;
  auVar40._8_2_ = uStack_10d4;
  auVar40._12_2_ = uStack_10d2;
  auVar40._14_2_ = uStack_10e2;
  auVar39._8_8_ = CONCAT44(uVar103,uVar103);
  auVar39._0_8_ = CONCAT44(uVar103,uVar103);
  auVar111 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_fe0;
  auVar38._0_2_ = uStack_fd0;
  auVar38._4_2_ = uStack_fce;
  auVar38._6_2_ = uStack_fde;
  auVar38._10_2_ = uStack_fdc;
  auVar38._8_2_ = uStack_fcc;
  auVar38._12_2_ = uStack_fca;
  auVar38._14_2_ = uStack_fda;
  auVar37._8_8_ = CONCAT44(uVar103,uVar103);
  auVar37._0_8_ = CONCAT44(uVar103,uVar103);
  auVar112 = pmaddwd(auVar38,auVar37);
  local_898 = auVar109._0_4_;
  uStack_894 = auVar109._4_4_;
  uStack_890 = auVar109._8_4_;
  uStack_88c = auVar109._12_4_;
  local_8b8 = auVar110._0_4_;
  uStack_8b4 = auVar110._4_4_;
  uStack_8b0 = auVar110._8_4_;
  uStack_8ac = auVar110._12_4_;
  local_8d8 = auVar111._0_4_;
  uStack_8d4 = auVar111._4_4_;
  uStack_8d0 = auVar111._8_4_;
  uStack_8cc = auVar111._12_4_;
  local_8f8 = auVar112._0_4_;
  uStack_8f4 = auVar112._4_4_;
  uStack_8f0 = auVar112._8_4_;
  uStack_8ec = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar84._4_4_ = uStack_894 + uStack_7a4 >> auVar109;
  auVar84._0_4_ = local_898 + local_7a8 >> auVar109;
  auVar84._12_4_ = uStack_88c + uStack_79c >> auVar109;
  auVar84._8_4_ = uStack_890 + uStack_7a0 >> auVar109;
  auVar83._4_4_ = uStack_8b4 + uStack_7a4 >> auVar110;
  auVar83._0_4_ = local_8b8 + local_7a8 >> auVar110;
  auVar83._12_4_ = uStack_8ac + uStack_79c >> auVar110;
  auVar83._8_4_ = uStack_8b0 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar84,auVar83);
  *(undefined1 (*) [16])(in_RDI + 0x250) = auVar109;
  auVar82._4_4_ = uStack_8d4 + uStack_7a4 >> auVar111;
  auVar82._0_4_ = local_8d8 + local_7a8 >> auVar111;
  auVar82._12_4_ = uStack_8cc + uStack_79c >> auVar111;
  auVar82._8_4_ = uStack_8d0 + uStack_7a0 >> auVar111;
  auVar81._4_4_ = uStack_8f4 + uStack_7a4 >> auVar112;
  auVar81._0_4_ = local_8f8 + local_7a8 >> auVar112;
  auVar81._12_4_ = uStack_8ec + uStack_79c >> auVar112;
  auVar81._8_4_ = uStack_8f0 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar82,auVar81);
  *(undefined1 (*) [16])(in_RDI + 0x3a0) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x260);
  uVar2 = *(undefined8 *)(in_RDI + 0x390);
  local_10f8 = (undefined2)uVar1;
  uStack_10f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1108 = (undefined2)uVar2;
  uStack_1106 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1104 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1102 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x268);
  uVar2 = *(undefined8 *)(in_RDI + 0x398);
  uStack_ff0 = (undefined2)uVar1;
  uStack_fee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_fec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_fea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1000 = (undefined2)uVar2;
  uStack_ffe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_ffc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_ffa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar36._2_2_ = local_1108;
  auVar36._0_2_ = local_10f8;
  auVar36._4_2_ = uStack_10f6;
  auVar36._6_2_ = uStack_1106;
  auVar36._10_2_ = uStack_1104;
  auVar36._8_2_ = uStack_10f4;
  auVar36._12_2_ = uStack_10f2;
  auVar36._14_2_ = uStack_1102;
  auVar35._8_8_ = CONCAT44(iVar104,iVar104);
  auVar35._0_8_ = CONCAT44(iVar104,iVar104);
  auVar109 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_1000;
  auVar34._0_2_ = uStack_ff0;
  auVar34._4_2_ = uStack_fee;
  auVar34._6_2_ = uStack_ffe;
  auVar34._10_2_ = uStack_ffc;
  auVar34._8_2_ = uStack_fec;
  auVar34._12_2_ = uStack_fea;
  auVar34._14_2_ = uStack_ffa;
  auVar33._8_8_ = CONCAT44(iVar104,iVar104);
  auVar33._0_8_ = CONCAT44(iVar104,iVar104);
  auVar110 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_1108;
  auVar32._0_2_ = local_10f8;
  auVar32._4_2_ = uStack_10f6;
  auVar32._6_2_ = uStack_1106;
  auVar32._10_2_ = uStack_1104;
  auVar32._8_2_ = uStack_10f4;
  auVar32._12_2_ = uStack_10f2;
  auVar32._14_2_ = uStack_1102;
  auVar31._8_8_ = uVar96;
  auVar31._0_8_ = uVar95;
  auVar111 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_1000;
  auVar30._0_2_ = uStack_ff0;
  auVar30._4_2_ = uStack_fee;
  auVar30._6_2_ = uStack_ffe;
  auVar30._10_2_ = uStack_ffc;
  auVar30._8_2_ = uStack_fec;
  auVar30._12_2_ = uStack_fea;
  auVar30._14_2_ = uStack_ffa;
  auVar29._8_8_ = uVar96;
  auVar29._0_8_ = uVar95;
  auVar112 = pmaddwd(auVar30,auVar29);
  local_918 = auVar109._0_4_;
  uStack_914 = auVar109._4_4_;
  uStack_910 = auVar109._8_4_;
  uStack_90c = auVar109._12_4_;
  local_938 = auVar110._0_4_;
  uStack_934 = auVar110._4_4_;
  uStack_930 = auVar110._8_4_;
  uStack_92c = auVar110._12_4_;
  local_958 = auVar111._0_4_;
  uStack_954 = auVar111._4_4_;
  uStack_950 = auVar111._8_4_;
  uStack_94c = auVar111._12_4_;
  local_978 = auVar112._0_4_;
  uStack_974 = auVar112._4_4_;
  uStack_970 = auVar112._8_4_;
  uStack_96c = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar80._4_4_ = uStack_914 + uStack_7a4 >> auVar109;
  auVar80._0_4_ = local_918 + local_7a8 >> auVar109;
  auVar80._12_4_ = uStack_90c + uStack_79c >> auVar109;
  auVar80._8_4_ = uStack_910 + uStack_7a0 >> auVar109;
  auVar79._4_4_ = uStack_934 + uStack_7a4 >> auVar110;
  auVar79._0_4_ = local_938 + local_7a8 >> auVar110;
  auVar79._12_4_ = uStack_92c + uStack_79c >> auVar110;
  auVar79._8_4_ = uStack_930 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar80,auVar79);
  *(undefined1 (*) [16])(in_RDI + 0x260) = auVar109;
  auVar78._4_4_ = uStack_954 + uStack_7a4 >> auVar111;
  auVar78._0_4_ = local_958 + local_7a8 >> auVar111;
  auVar78._12_4_ = uStack_94c + uStack_79c >> auVar111;
  auVar78._8_4_ = uStack_950 + uStack_7a0 >> auVar111;
  auVar77._4_4_ = uStack_974 + uStack_7a4 >> auVar112;
  auVar77._0_4_ = local_978 + local_7a8 >> auVar112;
  auVar77._12_4_ = uStack_96c + uStack_79c >> auVar112;
  auVar77._8_4_ = uStack_970 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar78,auVar77);
  *(undefined1 (*) [16])(in_RDI + 0x390) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x290);
  uVar2 = *(undefined8 *)(in_RDI + 0x360);
  local_1118 = (undefined2)uVar1;
  uStack_1116 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1114 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1112 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1128 = (undefined2)uVar2;
  uStack_1126 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1124 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1122 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x298);
  uVar2 = *(undefined8 *)(in_RDI + 0x368);
  uStack_1010 = (undefined2)uVar1;
  uStack_100e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_100c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_100a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1020 = (undefined2)uVar2;
  uStack_101e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_101c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_101a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_1128;
  auVar28._0_2_ = local_1118;
  auVar28._4_2_ = uStack_1116;
  auVar28._6_2_ = uStack_1126;
  auVar28._10_2_ = uStack_1124;
  auVar28._8_2_ = uStack_1114;
  auVar28._12_2_ = uStack_1112;
  auVar28._14_2_ = uStack_1122;
  auVar27._8_8_ = uVar98;
  auVar27._0_8_ = uVar97;
  auVar109 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_1020;
  auVar26._0_2_ = uStack_1010;
  auVar26._4_2_ = uStack_100e;
  auVar26._6_2_ = uStack_101e;
  auVar26._10_2_ = uStack_101c;
  auVar26._8_2_ = uStack_100c;
  auVar26._12_2_ = uStack_100a;
  auVar26._14_2_ = uStack_101a;
  auVar25._8_8_ = uVar98;
  auVar25._0_8_ = uVar97;
  auVar110 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_1128;
  auVar24._0_2_ = local_1118;
  auVar24._4_2_ = uStack_1116;
  auVar24._6_2_ = uStack_1126;
  auVar24._10_2_ = uStack_1124;
  auVar24._8_2_ = uStack_1114;
  auVar24._12_2_ = uStack_1112;
  auVar24._14_2_ = uStack_1122;
  auVar23._8_8_ = CONCAT44(uVar105,uVar105);
  auVar23._0_8_ = CONCAT44(uVar105,uVar105);
  auVar111 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_1020;
  auVar22._0_2_ = uStack_1010;
  auVar22._4_2_ = uStack_100e;
  auVar22._6_2_ = uStack_101e;
  auVar22._10_2_ = uStack_101c;
  auVar22._8_2_ = uStack_100c;
  auVar22._12_2_ = uStack_100a;
  auVar22._14_2_ = uStack_101a;
  auVar21._8_8_ = CONCAT44(uVar105,uVar105);
  auVar21._0_8_ = CONCAT44(uVar105,uVar105);
  auVar112 = pmaddwd(auVar22,auVar21);
  local_998 = auVar109._0_4_;
  uStack_994 = auVar109._4_4_;
  uStack_990 = auVar109._8_4_;
  uStack_98c = auVar109._12_4_;
  local_9b8 = auVar110._0_4_;
  uStack_9b4 = auVar110._4_4_;
  uStack_9b0 = auVar110._8_4_;
  uStack_9ac = auVar110._12_4_;
  local_9d8 = auVar111._0_4_;
  uStack_9d4 = auVar111._4_4_;
  uStack_9d0 = auVar111._8_4_;
  uStack_9cc = auVar111._12_4_;
  local_9f8 = auVar112._0_4_;
  uStack_9f4 = auVar112._4_4_;
  uStack_9f0 = auVar112._8_4_;
  uStack_9ec = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar76._4_4_ = uStack_994 + uStack_7a4 >> auVar109;
  auVar76._0_4_ = local_998 + local_7a8 >> auVar109;
  auVar76._12_4_ = uStack_98c + uStack_79c >> auVar109;
  auVar76._8_4_ = uStack_990 + uStack_7a0 >> auVar109;
  auVar75._4_4_ = uStack_9b4 + uStack_7a4 >> auVar110;
  auVar75._0_4_ = local_9b8 + local_7a8 >> auVar110;
  auVar75._12_4_ = uStack_9ac + uStack_79c >> auVar110;
  auVar75._8_4_ = uStack_9b0 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar76,auVar75);
  *(undefined1 (*) [16])(in_RDI + 0x290) = auVar109;
  auVar74._4_4_ = uStack_9d4 + uStack_7a4 >> auVar111;
  auVar74._0_4_ = local_9d8 + local_7a8 >> auVar111;
  auVar74._12_4_ = uStack_9cc + uStack_79c >> auVar111;
  auVar74._8_4_ = uStack_9d0 + uStack_7a0 >> auVar111;
  auVar73._4_4_ = uStack_9f4 + uStack_7a4 >> auVar112;
  auVar73._0_4_ = local_9f8 + local_7a8 >> auVar112;
  auVar73._12_4_ = uStack_9ec + uStack_79c >> auVar112;
  auVar73._8_4_ = uStack_9f0 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar74,auVar73);
  *(undefined1 (*) [16])(in_RDI + 0x360) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x2a0);
  uVar2 = *(undefined8 *)(in_RDI + 0x350);
  local_1138 = (undefined2)uVar1;
  uStack_1136 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1134 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1132 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1148 = (undefined2)uVar2;
  uStack_1146 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1144 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1142 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2a8);
  uVar2 = *(undefined8 *)(in_RDI + 0x358);
  uStack_1030 = (undefined2)uVar1;
  uStack_102e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_102c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_102a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1040 = (undefined2)uVar2;
  uStack_103e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_103c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_103a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_1148;
  auVar20._0_2_ = local_1138;
  auVar20._4_2_ = uStack_1136;
  auVar20._6_2_ = uStack_1146;
  auVar20._10_2_ = uStack_1144;
  auVar20._8_2_ = uStack_1134;
  auVar20._12_2_ = uStack_1132;
  auVar20._14_2_ = uStack_1142;
  auVar19._8_8_ = CONCAT44(iVar106,iVar106);
  auVar19._0_8_ = CONCAT44(iVar106,iVar106);
  auVar109 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_1040;
  auVar18._0_2_ = uStack_1030;
  auVar18._4_2_ = uStack_102e;
  auVar18._6_2_ = uStack_103e;
  auVar18._10_2_ = uStack_103c;
  auVar18._8_2_ = uStack_102c;
  auVar18._12_2_ = uStack_102a;
  auVar18._14_2_ = uStack_103a;
  auVar17._8_8_ = CONCAT44(iVar106,iVar106);
  auVar17._0_8_ = CONCAT44(iVar106,iVar106);
  auVar110 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_1148;
  auVar16._0_2_ = local_1138;
  auVar16._4_2_ = uStack_1136;
  auVar16._6_2_ = uStack_1146;
  auVar16._10_2_ = uStack_1144;
  auVar16._8_2_ = uStack_1134;
  auVar16._12_2_ = uStack_1132;
  auVar16._14_2_ = uStack_1142;
  auVar15._8_8_ = uVar98;
  auVar15._0_8_ = uVar97;
  auVar111 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_1040;
  auVar14._0_2_ = uStack_1030;
  auVar14._4_2_ = uStack_102e;
  auVar14._6_2_ = uStack_103e;
  auVar14._10_2_ = uStack_103c;
  auVar14._8_2_ = uStack_102c;
  auVar14._12_2_ = uStack_102a;
  auVar14._14_2_ = uStack_103a;
  auVar13._8_8_ = uVar98;
  auVar13._0_8_ = uVar97;
  auVar112 = pmaddwd(auVar14,auVar13);
  local_a18 = auVar109._0_4_;
  uStack_a14 = auVar109._4_4_;
  uStack_a10 = auVar109._8_4_;
  uStack_a0c = auVar109._12_4_;
  local_a38 = auVar110._0_4_;
  uStack_a34 = auVar110._4_4_;
  uStack_a30 = auVar110._8_4_;
  uStack_a2c = auVar110._12_4_;
  local_a58 = auVar111._0_4_;
  uStack_a54 = auVar111._4_4_;
  uStack_a50 = auVar111._8_4_;
  uStack_a4c = auVar111._12_4_;
  local_a78 = auVar112._0_4_;
  uStack_a74 = auVar112._4_4_;
  uStack_a70 = auVar112._8_4_;
  uStack_a6c = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar72._4_4_ = uStack_a14 + uStack_7a4 >> auVar109;
  auVar72._0_4_ = local_a18 + local_7a8 >> auVar109;
  auVar72._12_4_ = uStack_a0c + uStack_79c >> auVar109;
  auVar72._8_4_ = uStack_a10 + uStack_7a0 >> auVar109;
  auVar71._4_4_ = uStack_a34 + uStack_7a4 >> auVar110;
  auVar71._0_4_ = local_a38 + local_7a8 >> auVar110;
  auVar71._12_4_ = uStack_a2c + uStack_79c >> auVar110;
  auVar71._8_4_ = uStack_a30 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar72,auVar71);
  *(undefined1 (*) [16])(in_RDI + 0x2a0) = auVar109;
  auVar70._4_4_ = uStack_a54 + uStack_7a4 >> auVar111;
  auVar70._0_4_ = local_a58 + local_7a8 >> auVar111;
  auVar70._12_4_ = uStack_a4c + uStack_79c >> auVar111;
  auVar70._8_4_ = uStack_a50 + uStack_7a0 >> auVar111;
  auVar69._4_4_ = uStack_a74 + uStack_7a4 >> auVar112;
  auVar69._0_4_ = local_a78 + local_7a8 >> auVar112;
  auVar69._12_4_ = uStack_a6c + uStack_79c >> auVar112;
  auVar69._8_4_ = uStack_a70 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar70,auVar69);
  *(undefined1 (*) [16])(in_RDI + 0x350) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x2d0);
  uVar2 = *(undefined8 *)(in_RDI + 800);
  local_1158 = (undefined2)uVar1;
  uStack_1156 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1154 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1152 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1168 = (undefined2)uVar2;
  uStack_1166 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1164 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1162 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2d8);
  uVar2 = *(undefined8 *)(in_RDI + 0x328);
  uStack_1050 = (undefined2)uVar1;
  uStack_104e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_104c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_104a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1060 = (undefined2)uVar2;
  uStack_105e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_105c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_105a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_1168;
  auVar12._0_2_ = local_1158;
  auVar12._4_2_ = uStack_1156;
  auVar12._6_2_ = uStack_1166;
  auVar12._10_2_ = uStack_1164;
  auVar12._8_2_ = uStack_1154;
  auVar12._12_2_ = uStack_1152;
  auVar12._14_2_ = uStack_1162;
  auVar11._8_8_ = uVar100;
  auVar11._0_8_ = uVar99;
  auVar109 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_1060;
  auVar10._0_2_ = uStack_1050;
  auVar10._4_2_ = uStack_104e;
  auVar10._6_2_ = uStack_105e;
  auVar10._10_2_ = uStack_105c;
  auVar10._8_2_ = uStack_104c;
  auVar10._12_2_ = uStack_104a;
  auVar10._14_2_ = uStack_105a;
  auVar9._8_8_ = uVar100;
  auVar9._0_8_ = uVar99;
  auVar110 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_1168;
  auVar8._0_2_ = local_1158;
  auVar8._4_2_ = uStack_1156;
  auVar8._6_2_ = uStack_1166;
  auVar8._10_2_ = uStack_1164;
  auVar8._8_2_ = uStack_1154;
  auVar8._12_2_ = uStack_1152;
  auVar8._14_2_ = uStack_1162;
  auVar7._8_8_ = CONCAT44(uVar107,uVar107);
  auVar7._0_8_ = CONCAT44(uVar107,uVar107);
  auVar111 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_1060;
  auVar6._0_2_ = uStack_1050;
  auVar6._4_2_ = uStack_104e;
  auVar6._6_2_ = uStack_105e;
  auVar6._10_2_ = uStack_105c;
  auVar6._8_2_ = uStack_104c;
  auVar6._12_2_ = uStack_104a;
  auVar6._14_2_ = uStack_105a;
  auVar5._8_8_ = CONCAT44(uVar107,uVar107);
  auVar5._0_8_ = CONCAT44(uVar107,uVar107);
  auVar112 = pmaddwd(auVar6,auVar5);
  local_a98 = auVar109._0_4_;
  uStack_a94 = auVar109._4_4_;
  uStack_a90 = auVar109._8_4_;
  uStack_a8c = auVar109._12_4_;
  local_ab8 = auVar110._0_4_;
  uStack_ab4 = auVar110._4_4_;
  uStack_ab0 = auVar110._8_4_;
  uStack_aac = auVar110._12_4_;
  local_ad8 = auVar111._0_4_;
  uStack_ad4 = auVar111._4_4_;
  uStack_ad0 = auVar111._8_4_;
  uStack_acc = auVar111._12_4_;
  local_af8 = auVar112._0_4_;
  uStack_af4 = auVar112._4_4_;
  uStack_af0 = auVar112._8_4_;
  uStack_aec = auVar112._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar68._4_4_ = uStack_a94 + uStack_7a4 >> auVar109;
  auVar68._0_4_ = local_a98 + local_7a8 >> auVar109;
  auVar68._12_4_ = uStack_a8c + uStack_79c >> auVar109;
  auVar68._8_4_ = uStack_a90 + uStack_7a0 >> auVar109;
  auVar67._4_4_ = uStack_ab4 + uStack_7a4 >> auVar110;
  auVar67._0_4_ = local_ab8 + local_7a8 >> auVar110;
  auVar67._12_4_ = uStack_aac + uStack_79c >> auVar110;
  auVar67._8_4_ = uStack_ab0 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar68,auVar67);
  *(undefined1 (*) [16])(in_RDI + 0x2d0) = auVar109;
  auVar66._4_4_ = uStack_ad4 + uStack_7a4 >> auVar111;
  auVar66._0_4_ = local_ad8 + local_7a8 >> auVar111;
  auVar66._12_4_ = uStack_acc + uStack_79c >> auVar111;
  auVar66._8_4_ = uStack_ad0 + uStack_7a0 >> auVar111;
  auVar65._4_4_ = uStack_af4 + uStack_7a4 >> auVar112;
  auVar65._0_4_ = local_af8 + local_7a8 >> auVar112;
  auVar65._12_4_ = uStack_aec + uStack_79c >> auVar112;
  auVar65._8_4_ = uStack_af0 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar66,auVar65);
  *(undefined1 (*) [16])(in_RDI + 800) = auVar109;
  uVar1 = *(undefined8 *)(in_RDI + 0x2e0);
  uVar2 = *(undefined8 *)(in_RDI + 0x310);
  local_1178 = (undefined2)uVar1;
  uStack_1176 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1174 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1172 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1188 = (undefined2)uVar2;
  uStack_1186 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1184 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1182 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2e8);
  uVar2 = *(undefined8 *)(in_RDI + 0x318);
  uStack_1070 = (undefined2)uVar1;
  uStack_106e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_106c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_106a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1080 = (undefined2)uVar2;
  uStack_107e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_107c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_107a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_1188;
  auVar4._0_2_ = local_1178;
  auVar4._4_2_ = uStack_1176;
  auVar4._6_2_ = uStack_1186;
  auVar4._10_2_ = uStack_1184;
  auVar4._8_2_ = uStack_1174;
  auVar4._12_2_ = uStack_1172;
  auVar4._14_2_ = uStack_1182;
  auVar113._8_8_ = CONCAT44(iVar108,iVar108);
  auVar113._0_8_ = CONCAT44(iVar108,iVar108);
  auVar113 = pmaddwd(auVar4,auVar113);
  auVar3._2_2_ = uStack_1080;
  auVar3._0_2_ = uStack_1070;
  auVar3._4_2_ = uStack_106e;
  auVar3._6_2_ = uStack_107e;
  auVar3._10_2_ = uStack_107c;
  auVar3._8_2_ = uStack_106c;
  auVar3._12_2_ = uStack_106a;
  auVar3._14_2_ = uStack_107a;
  auVar114._8_8_ = CONCAT44(iVar108,iVar108);
  auVar114._0_8_ = CONCAT44(iVar108,iVar108);
  auVar114 = pmaddwd(auVar3,auVar114);
  auVar112._2_2_ = local_1188;
  auVar112._0_2_ = local_1178;
  auVar112._4_2_ = uStack_1176;
  auVar112._6_2_ = uStack_1186;
  auVar112._10_2_ = uStack_1184;
  auVar112._8_2_ = uStack_1174;
  auVar112._12_2_ = uStack_1172;
  auVar112._14_2_ = uStack_1182;
  auVar111._8_8_ = uVar100;
  auVar111._0_8_ = uVar99;
  auVar111 = pmaddwd(auVar112,auVar111);
  auVar110._2_2_ = uStack_1080;
  auVar110._0_2_ = uStack_1070;
  auVar110._4_2_ = uStack_106e;
  auVar110._6_2_ = uStack_107e;
  auVar110._10_2_ = uStack_107c;
  auVar110._8_2_ = uStack_106c;
  auVar110._12_2_ = uStack_106a;
  auVar110._14_2_ = uStack_107a;
  auVar109._8_8_ = uVar100;
  auVar109._0_8_ = uVar99;
  auVar109 = pmaddwd(auVar110,auVar109);
  local_b18 = auVar113._0_4_;
  uStack_b14 = auVar113._4_4_;
  uStack_b10 = auVar113._8_4_;
  uStack_b0c = auVar113._12_4_;
  local_b38 = auVar114._0_4_;
  uStack_b34 = auVar114._4_4_;
  uStack_b30 = auVar114._8_4_;
  uStack_b2c = auVar114._12_4_;
  local_b58 = auVar111._0_4_;
  uStack_b54 = auVar111._4_4_;
  uStack_b50 = auVar111._8_4_;
  uStack_b4c = auVar111._12_4_;
  local_b78 = auVar109._0_4_;
  uStack_b74 = auVar109._4_4_;
  uStack_b70 = auVar109._8_4_;
  uStack_b6c = auVar109._12_4_;
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar64._4_4_ = uStack_b14 + uStack_7a4 >> auVar109;
  auVar64._0_4_ = local_b18 + local_7a8 >> auVar109;
  auVar64._12_4_ = uStack_b0c + uStack_79c >> auVar109;
  auVar64._8_4_ = uStack_b10 + uStack_7a0 >> auVar109;
  auVar63._4_4_ = uStack_b34 + uStack_7a4 >> auVar110;
  auVar63._0_4_ = local_b38 + local_7a8 >> auVar110;
  auVar63._12_4_ = uStack_b2c + uStack_79c >> auVar110;
  auVar63._8_4_ = uStack_b30 + uStack_7a0 >> auVar110;
  auVar109 = packssdw(auVar64,auVar63);
  *(undefined1 (*) [16])(in_RDI + 0x2e0) = auVar109;
  auVar62._4_4_ = uStack_b54 + uStack_7a4 >> auVar111;
  auVar62._0_4_ = local_b58 + local_7a8 >> auVar111;
  auVar62._12_4_ = uStack_b4c + uStack_79c >> auVar111;
  auVar62._8_4_ = uStack_b50 + uStack_7a0 >> auVar111;
  auVar61._4_4_ = uStack_b74 + uStack_7a4 >> auVar112;
  auVar61._0_4_ = local_b78 + local_7a8 >> auVar112;
  auVar61._12_4_ = uStack_b6c + uStack_79c >> auVar112;
  auVar61._8_4_ = uStack_b70 + uStack_7a0 >> auVar112;
  auVar109 = packssdw(auVar62,auVar61);
  *(undefined1 (*) [16])(in_RDI + 0x310) = auVar109;
  return;
}

Assistant:

static inline void idct64_stage4_high32_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  const __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  const __m128i cospi_m60_m04 = pair_set_epi16(-cospi[60], -cospi[4]);
  const __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  const __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  const __m128i cospi_m28_m36 = pair_set_epi16(-cospi[28], -cospi[36]);
  const __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  const __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  const __m128i cospi_m44_m20 = pair_set_epi16(-cospi[44], -cospi[20]);
  const __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);
  const __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  const __m128i cospi_m12_m52 = pair_set_epi16(-cospi[12], -cospi[52]);
  btf_16_sse2(cospi_m04_p60, cospi_p60_p04, x[33], x[62], x[33], x[62]);
  btf_16_sse2(cospi_m60_m04, cospi_m04_p60, x[34], x[61], x[34], x[61]);
  btf_16_sse2(cospi_m36_p28, cospi_p28_p36, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m28_m36, cospi_m36_p28, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m20_p44, cospi_p44_p20, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m44_m20, cospi_m20_p44, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m52_p12, cospi_p12_p52, x[45], x[50], x[45], x[50]);
  btf_16_sse2(cospi_m12_m52, cospi_m52_p12, x[46], x[49], x[46], x[49]);
}